

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int normal_scanPercent(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  ATTRIBUTE *pAVar5;
  long lVar6;
  uint uVar7;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  int iVar8;
  int iVar9;
  
  pAVar5 = (ATTRIBUTE *)(end + -(long)ptr);
  if ((long)pAVar5 < 1) {
    return -1;
  }
  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  iVar8 = 0;
  uVar7 = bVar1 - 5;
  if (uVar7 < 0x14) {
    iVar9 = 0;
    switch((uint)bVar1) {
    case 5:
      if (pAVar5 == (ATTRIBUTE *)0x1) {
        return -2;
      }
      iVar2 = (*enc[3].nameLength)(enc,ptr);
      iVar9 = iVar8;
      if (iVar2 == 0) {
        iVar2 = (*enc[3].literalScanners[0])(enc,ptr,extraout_RDX_00,&pAVar5->name);
        while( true ) {
          lVar6 = 2;
          while( true ) {
            iVar9 = iVar8;
            if (iVar2 == 0) goto switchD_005800a5_caseD_8;
LAB_00580167:
            while( true ) {
              ptr = (char *)((byte *)ptr + lVar6);
              uVar3 = (long)end - (long)ptr;
              if ((long)uVar3 < 1) {
                return -1;
              }
              pAVar5 = (ATTRIBUTE *)(ulong)(byte)*ptr;
              bVar1 = *(byte *)((long)&pAVar5->name + (long)enc[1].scanners);
              if (bVar1 < 0x12) break;
              lVar6 = 1;
              if ((3 < bVar1 - 0x18) && (bVar1 != 0x16)) {
                iVar9 = iVar8;
                if (bVar1 == 0x12) {
                  ptr = (char *)((byte *)ptr + 1);
                  iVar9 = 0x1c;
                }
                goto switchD_005800a5_caseD_8;
              }
            }
            if (bVar1 == 5) break;
            if (bVar1 == 6) {
              if (uVar3 < 3) {
                return -2;
              }
              pcVar4 = (*enc[3].skipS)(enc,ptr);
              iVar9 = iVar8;
              if ((int)pcVar4 != 0) goto switchD_005800a5_caseD_8;
              iVar2 = (*enc[3].scanners[1])(enc,ptr,extraout_RDX_03,&pAVar5->name);
LAB_00580237:
              lVar6 = 3;
            }
            else {
              iVar9 = iVar8;
              if (bVar1 != 7) goto switchD_005800a5_caseD_8;
              if (uVar3 < 4) {
                return -2;
              }
              iVar2 = (*enc[3].getAtts)(enc,ptr,(uint)bVar1,pAVar5);
              if (iVar2 != 0) goto switchD_005800a5_caseD_8;
              iVar2 = (*enc[3].scanners[2])(enc,ptr,extraout_RDX_02,&pAVar5->name);
LAB_005801f8:
              lVar6 = 4;
            }
          }
          if (uVar3 == 1) {
            return -2;
          }
          iVar2 = (*enc[3].nameLength)(enc,ptr);
          iVar9 = iVar8;
          if (iVar2 != 0) break;
          iVar2 = (*enc[3].scanners[0])(enc,ptr,extraout_RDX_04,&pAVar5->name);
        }
      }
      break;
    case 6:
      if (pAVar5 < (ATTRIBUTE *)0x3) {
        return -2;
      }
      pcVar4 = (*enc[3].skipS)(enc,ptr);
      iVar9 = iVar8;
      if ((int)pcVar4 == 0) {
        iVar2 = (*enc[3].literalScanners[1])(enc,ptr,extraout_RDX,&pAVar5->name);
        goto LAB_00580237;
      }
      break;
    case 7:
      if (pAVar5 < (ATTRIBUTE *)0x4) {
        return -2;
      }
      iVar2 = (*enc[3].getAtts)(enc,ptr,(&switchD_005800a5::switchdataD_0073b010)[uVar7] + 0x73b010,
                                pAVar5);
      iVar9 = iVar8;
      if (iVar2 == 0) {
        iVar2 = (*enc[3].nameMatchesAscii)(enc,ptr,extraout_RDX_01,(char *)pAVar5);
        goto LAB_005801f8;
      }
      break;
    case 9:
    case 10:
    case 0x15:
      goto switchD_005800a5_caseD_9;
    case 0x16:
    case 0x18:
      lVar6 = 1;
      goto LAB_00580167;
    }
  }
  else {
    iVar9 = iVar8;
    if (bVar1 != 0x1e) goto switchD_005800a5_caseD_8;
switchD_005800a5_caseD_9:
    iVar9 = 0x16;
  }
switchD_005800a5_caseD_8:
  *nextTokPtr = ptr;
  return iVar9;
}

Assistant:

static int PTRCALL
PREFIX(scanPercent)(const ENCODING *enc, const char *ptr, const char *end,
                    const char **nextTokPtr) {
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_S:
  case BT_LF:
  case BT_CR:
  case BT_PERCNT:
    *nextTokPtr = ptr;
    return XML_TOK_PERCENT;
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_PARAM_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}